

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  ulong uVar1;
  uint i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 in_XMM5_Qa;
  double dVar18;
  undefined8 in_XMM5_Qb;
  float fVar19;
  float fVar20;
  double weightedDotProducts [64];
  float afStack_308 [64];
  double adStack_208 [64];
  
  uVar1 = (ulong)size;
  if (size == 0) {
    dVar7 = 0.0;
    fVar15 = 0.0;
    fVar14 = 0.0;
  }
  else {
    fVar15 = 0.0;
    dVar7 = 0.0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar6 = (*weights)[uVar4];
      fVar10 = (float)uVar6;
      fVar14 = (*vectors)[uVar4].m_s[0];
      fVar13 = fVar14 * fVar10;
      afStack_308[uVar4] = fVar13;
      fVar15 = fVar15 + fVar13;
      uVar3 = uVar3 + uVar6;
      dVar11 = (double)(fVar14 * fVar14 * fVar10);
      adStack_208[uVar4] = dVar11;
      dVar7 = dVar7 + dVar11;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if ((long)uVar3 < 0) {
      fVar14 = (float)uVar3;
    }
    else {
      fVar14 = (float)(long)uVar3;
    }
  }
  fVar10 = 1.0;
  fVar13 = (1.0 / fVar14) * fVar15;
  (*result)[1].m_s[0] = fVar13;
  (*result)[0].m_s[0] = fVar13;
  if (size == 1) {
    return;
  }
  fVar15 = (float)(dVar7 - (double)((fVar15 * fVar15) / fVar14));
  auVar8 = ZEXT416((uint)fVar15);
  if (fVar15 <= 0.0) {
    return;
  }
  if (size != 0) {
    uVar16 = 0;
    uVar17 = 0xbff00000;
    uVar3 = 0;
    do {
      fVar15 = (*vectors)[uVar3].m_s[0];
      auVar8 = ZEXT416((uint)fVar15);
      fVar15 = fVar15 - fVar13;
      dVar7 = (double)(fVar15 * fVar15);
      if (dVar7 < (double)CONCAT44(uVar17,uVar16) || dVar7 == (double)CONCAT44(uVar17,uVar16)) {
        auVar8._8_4_ = (int)in_XMM5_Qb;
        auVar8._0_8_ = in_XMM5_Qa;
        auVar8._12_4_ = (int)((ulong)in_XMM5_Qb >> 0x20);
      }
      if (dVar7 <= (double)CONCAT44(uVar17,uVar16)) {
        dVar7 = (double)CONCAT44(uVar17,uVar16);
      }
      uVar3 = uVar3 + 1;
      uVar16 = SUB84(dVar7,0);
      uVar17 = (undefined4)((ulong)dVar7 >> 0x20);
      in_XMM5_Qa = auVar8._0_8_;
      in_XMM5_Qb = auVar8._8_8_;
    } while (uVar1 != uVar3);
    if (size != 0) {
      uVar16 = 0;
      uVar17 = 0xbff00000;
      uVar3 = 0;
      do {
        fVar15 = (*vectors)[uVar3].m_s[0];
        fVar19 = fVar15 - auVar8._0_4_;
        dVar11 = (double)(fVar19 * fVar19);
        dVar18 = (double)(ulong)(uint)fVar15;
        if (dVar11 < (double)CONCAT44(uVar17,uVar16) || dVar11 == (double)CONCAT44(uVar17,uVar16)) {
          dVar18 = dVar7;
        }
        if (dVar11 <= (double)CONCAT44(uVar17,uVar16)) {
          dVar11 = (double)CONCAT44(uVar17,uVar16);
        }
        uVar3 = uVar3 + 1;
        uVar16 = SUB84(dVar11,0);
        uVar17 = (undefined4)((ulong)dVar11 >> 0x20);
        dVar7 = dVar18;
      } while (uVar1 != uVar3);
      auVar9._0_4_ = (auVar8._0_4_ + fVar13) * 0.5;
      auVar9._4_4_ = (SUB84(dVar18,0) + fVar13) * 0.5;
      auVar9._8_4_ = (auVar8._4_4_ + fVar13) * 0.0;
      auVar9._12_4_ = ((float)((ulong)dVar18 >> 0x20) + fVar13) * 0.0;
      if (2 < size) {
        fVar15 = 0.0;
        uVar3 = 0;
        do {
          fVar19 = (*vectors)[uVar3].m_s[0] - fVar13;
          fVar15 = fVar15 + (float)(*weights)[uVar3] * fVar19 * fVar19;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        iVar2 = 10;
        do {
          fVar10 = fVar10 * (fVar15 / fVar14);
          fVar19 = fVar10 + 0.0;
          uVar6 = -(uint)(fVar10 != 0.0);
          fVar10 = (float)(uVar6 & (uint)((1.0 / fVar19) * fVar19) | ~uVar6 & (uint)fVar19);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        uVar6 = -(uint)(fVar10 * fVar10 != 0.0);
        auVar12 = ZEXT816(0);
        uVar3 = 0;
        fVar15 = 0.0;
        fVar14 = 0.0;
        do {
          fVar19 = fVar14;
          if (0.0 <= ((*vectors)[uVar3].m_s[0] - fVar13) *
                     (float)(~uVar6 & (uint)fVar10 |
                            (uint)((1.0 / SQRT(fVar10 * fVar10)) * fVar10) & uVar6)) {
            fVar14 = fVar19 + afStack_308[uVar3];
            auVar12._8_8_ = auVar12._8_8_ + (double)(*weights)[uVar3];
          }
          else {
            fVar15 = fVar15 + afStack_308[uVar3];
            auVar12._0_8_ = auVar12._0_8_ + (double)(*weights)[uVar3];
            fVar14 = fVar19;
          }
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        if ((0.0 < auVar12._0_8_) && (0.0 < auVar12._8_8_)) {
          auVar8 = divpd(_DAT_001b7a90,auVar12);
          auVar9._4_4_ = fVar14 * (float)auVar8._8_8_;
          auVar9._0_4_ = fVar15 * (float)auVar8._0_8_;
          auVar9._8_4_ = fVar19 * 0.0;
          auVar9._12_4_ = fVar19 * 0.0;
        }
      }
      goto LAB_00187099;
    }
  }
  auVar9._4_4_ = NAN;
  auVar9._0_4_ = (fVar13 + auVar8._0_4_) * 0.5;
  auVar9._8_8_ = 0;
LAB_00187099:
  fVar15 = auVar9._4_4_;
  iVar2 = 0;
  fVar14 = 1e+10;
  do {
    if (size == 0) {
      return;
    }
    fVar13 = 0.0;
    dVar7 = 0.0;
    uVar5 = 0;
    dVar11 = 0.0;
    uVar3 = 0;
    uVar4 = 0;
    fVar10 = 0.0;
    do {
      fVar19 = (*vectors)[uVar5].m_s[0];
      fVar20 = auVar9._0_4_ - fVar19;
      fVar19 = fVar15 - fVar19;
      if (fVar19 * fVar19 <= fVar20 * fVar20) {
        fVar13 = fVar13 + afStack_308[uVar5];
        dVar7 = dVar7 + adStack_208[uVar5];
        uVar3 = uVar3 + (*weights)[uVar5];
      }
      else {
        fVar10 = fVar10 + afStack_308[uVar5];
        dVar11 = dVar11 + adStack_208[uVar5];
        uVar4 = uVar4 + (*weights)[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    if (uVar4 == 0) {
      return;
    }
    if (uVar3 == 0) {
      return;
    }
    fVar19 = (float)(dVar7 - (double)((fVar13 * fVar13) / (float)uVar3)) +
             (float)(dVar11 - (double)((fVar10 * fVar10) / (float)uVar4));
    fVar10 = (1.0 / (float)uVar4) * fVar10;
    auVar9 = ZEXT416((uint)fVar10);
    fVar15 = (1.0 / (float)uVar3) * fVar13;
  } while (((1e-05 <= fVar19) && (1e-05 <= (fVar14 - fVar19) / fVar19)) &&
          (iVar2 = iVar2 + 1, fVar14 = fVar19, iVar2 != 0x400));
  (*result)[0].m_s[0] = fVar10;
  (*result)[1].m_s[0] = fVar15;
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}